

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O0

void tf::SmallVectorTemplateBase<int,true>::uninitialized_copy<int,int>
               (int *I,int *E,int *Dest,type *param_4)

{
  void *in_RDX;
  void *in_RSI;
  void *in_RDI;
  
  if (in_RDI != in_RSI) {
    memcpy(in_RDX,in_RDI,((long)in_RSI - (long)in_RDI >> 2) << 2);
  }
  return;
}

Assistant:

static void uninitialized_copy(
      T1 *I, T1 *E, T2 *Dest,
      typename std::enable_if<std::is_same<typename std::remove_const<T1>::type,
                                           T2>::value>::type * = nullptr) {
    // Use memcpy for PODs iterated by pointers (which includes SmallVector
    // iterators): std::uninitialized_copy optimizes to memmove, but we can
    // use memcpy here. Note that I and E are iterators and thus might be
    // invalid for memcpy if they are equal.
    if (I != E)
      memcpy(Dest, I, (E - I) * sizeof(T));
  }